

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Regexp * duckdb_re2::Regexp::HaveMatch(int match_id,ParseFlags flags)

{
  Regexp *pRVar1;
  
  pRVar1 = (Regexp *)operator_new(0x28);
  pRVar1->op_ = '\x15';
  pRVar1->simple_ = '\0';
  pRVar1->parse_flags_ = (uint16_t)flags;
  pRVar1->ref_ = 1;
  *(undefined2 *)((long)&pRVar1->arguments + 0xe) = 0;
  *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
  *(undefined8 *)((long)&(pRVar1->arguments).char_class.cc_ + 6) = 0;
  *(undefined8 *)&pRVar1->nsub_ = 0;
  *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
  (pRVar1->arguments).repeat.max_ = match_id;
  return pRVar1;
}

Assistant:

Regexp* Regexp::HaveMatch(int match_id, ParseFlags flags) {
  Regexp* re = new Regexp(kRegexpHaveMatch, flags);
  re->arguments.match_id_ = match_id;
  return re;
}